

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

kvs_ops_stat * filemgr_migrate_op_stats(filemgr *old_file,filemgr *new_file,kvs_info *kvs)

{
  kvs_ops_stat *this;
  
  if (new_file == (filemgr *)0x0) {
    this = (kvs_ops_stat *)0x0;
  }
  else {
    pthread_spin_lock(&old_file->lock);
    this = &(new_file->header).op_stat;
    kvs_ops_stat::operator=(this,&(old_file->header).op_stat);
    pthread_spin_unlock(&old_file->lock);
  }
  return this;
}

Assistant:

struct kvs_ops_stat *filemgr_migrate_op_stats(struct filemgr *old_file,
                                              struct filemgr *new_file,
                                              struct kvs_info *kvs)
{
    kvs_ops_stat *ret = NULL;
    if (new_file == NULL) {
        return NULL;
    }

    spin_lock(&old_file->lock);
    new_file->header.op_stat = old_file->header.op_stat;
    ret = &new_file->header.op_stat;
    spin_unlock(&old_file->lock);
    return ret;
}